

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzline.cpp
# Opt level: O3

void pztopology::TPZLine::TShape<Fad<double>>
               (TPZVec<Fad<double>_> *loc,TPZFMatrix<Fad<double>_> *phi,
               TPZFMatrix<Fad<double>_> *dphi)

{
  uint uVar1;
  Fad<double> *pFVar2;
  long lVar3;
  ulong uVar4;
  Fad<double> x;
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
  local_78;
  Fad<double> local_60;
  FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> local_40;
  
  pFVar2 = loc->fStore;
  local_60.val_ = pFVar2->val_;
  uVar1 = (pFVar2->dx_).num_elts;
  local_60.dx_.ptr_to_data = (double *)0x0;
  local_60.dx_.num_elts = uVar1;
  if ((long)(int)uVar1 != 0) {
    uVar4 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar4 = (long)(int)uVar1 << 3;
    }
    local_60.dx_.ptr_to_data = (double *)operator_new__(uVar4);
    MEM_CPY<double>::copy
              ((MEM_CPY<double> *)local_60.dx_.ptr_to_data,(EVP_PKEY_CTX *)(pFVar2->dx_).ptr_to_data
               ,(EVP_PKEY_CTX *)(ulong)uVar1);
  }
  local_60.defaultVal = pFVar2->defaultVal;
  local_40.fadexpr_.left_.constant_ = 1.0;
  local_40.fadexpr_.left_.defaultVal = 0.0;
  local_78.fadexpr_.right_.constant_ = 2.0;
  local_78.fadexpr_.right_.defaultVal = 0.0;
  local_78.fadexpr_.left_ = &local_40;
  local_40.fadexpr_.right_ = &local_60;
  if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 1) ||
     ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  Fad<double>::operator=(phi->fElem,&local_78);
  local_40.fadexpr_.left_.constant_ = 1.0;
  local_40.fadexpr_.left_.defaultVal = 0.0;
  local_78.fadexpr_.right_.constant_ = 2.0;
  local_78.fadexpr_.right_.defaultVal = 0.0;
  if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 2) ||
     ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
    local_78.fadexpr_.left_ = &local_40;
    local_40.fadexpr_.right_ = &local_60;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_78.fadexpr_.left_ = &local_40;
  local_40.fadexpr_.right_ = &local_60;
  Fad<double>::operator=
            (phi->fElem + 1,
             (FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
              *)&local_78);
  if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 1) ||
     ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pFVar2 = dphi->fElem;
  pFVar2->val_ = -0.5;
  if ((pFVar2->dx_).num_elts != 0) {
    local_40._0_8_ = 0;
    Vector<double>::operator=(&pFVar2->dx_,(double *)&local_40);
  }
  lVar3 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
  if ((0 < lVar3) && (1 < (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol)) {
    pFVar2 = dphi->fElem;
    pFVar2[lVar3].val_ = 0.5;
    if (pFVar2[lVar3].dx_.num_elts != 0) {
      local_40._0_8_ = 0;
      Vector<double>::operator=(&pFVar2[lVar3].dx_,(double *)&local_40);
    }
    Fad<double>::~Fad(&local_60);
    return;
  }
  TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h",
             0x26d);
}

Assistant:

inline void TPZLine::TShape(const TPZVec<T> &loc,TPZFMatrix<T> &phi,TPZFMatrix<T> &dphi) {
        T x = loc[0];
        phi(0,0) = (1.0-x)/2.;
        phi(1,0) = (1.0+x)/2.;
        dphi(0,0) = -0.5;
        dphi(0,1) = 0.5;
    }